

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2aVaryingInterpolationTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::gles2::Accuracy::InterpolationCase::iterate(InterpolationCase *this)

{
  ostringstream *poVar1;
  Vec3 *w;
  TextureFormat log;
  RenderContext *pRVar2;
  TestContext *this_00;
  bool bVar3;
  deUint32 seed;
  int iVar4;
  int y;
  GLuint index;
  GLuint index_00;
  GLint GVar5;
  GLenum err;
  int iVar6;
  RenderTarget *pRVar7;
  mapped_type *pmVar8;
  TestError *pTVar9;
  NotSupportedError *this_01;
  char *description;
  int py;
  int y_00;
  int px;
  int x;
  ulong uVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  undefined1 auVar17 [16];
  float fVar18;
  qpTestResult testResult;
  Vec3 scale;
  Vec3 bias;
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_448;
  float local_438;
  float local_434;
  float local_430;
  float local_42c;
  float local_428;
  float local_424;
  float local_420;
  float local_41c;
  int score;
  float local_414;
  float local_410;
  float local_40c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408;
  Vec3 triW [2];
  Vec3 triG [2];
  Vec3 triB [2];
  Surface rendered;
  float positions [16];
  Surface reference;
  Vec4 local_2d0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  templateParams;
  Random rnd;
  undefined1 local_280 [384];
  ShaderProgram program;
  
  log = (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  seed = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,seed);
  pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
  if (pRVar7->m_width < 0x80) {
LAB_00e3331c:
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Too small viewport",glcts::fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/accuracy/es2aVaryingInterpolationTests.cpp"
               ,0xa0);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
  if (pRVar7->m_height < 0x80) goto LAB_00e3331c;
  pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar4 = de::Random::getInt(&rnd,0,pRVar7->m_width + -0x80);
  pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
  y = de::Random::getInt(&rnd,0,pRVar7->m_height + -0x80);
  templateParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &templateParams._M_t._M_impl.super__Rb_tree_header._M_header;
  templateParams._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  templateParams._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  templateParams._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  templateParams._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       templateParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  glu::getPrecisionName(this->m_precision);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_280,"PRECISION",(allocator<char> *)&program);
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&templateParams,(key_type *)local_280);
  std::__cxx11::string::assign((char *)pmVar8);
  std::__cxx11::string::~string((string *)local_280);
  pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&score,
             "attribute highp vec4 a_position;\nattribute ${PRECISION} vec3 a_coords;\nvarying ${PRECISION} vec3 v_coords;\n\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_coords = a_coords;\n}\n"
             ,(allocator<char> *)&rendered);
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_458,(string *)&score);
  tcu::StringTemplate::specialize((string *)positions,(StringTemplate *)local_458,&templateParams);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)triW,
             "varying ${PRECISION} vec3 v_coords;\nuniform ${PRECISION} vec3 u_scale;\nuniform ${PRECISION} vec3 u_bias;\n\nvoid main (void)\n{\n\tgl_FragColor = vec4(v_coords * u_scale + u_bias, 1.0);\n}\n"
             ,(allocator<char> *)&reference);
  tcu::StringTemplate::StringTemplate((StringTemplate *)triB,(string *)triW);
  tcu::StringTemplate::specialize((string *)triG,(StringTemplate *)triB,&templateParams);
  glu::makeVtxFragSources((ProgramSources *)local_280,(string *)positions,(string *)triG);
  glu::ShaderProgram::ShaderProgram(&program,pRVar2,(ProgramSources *)local_280);
  glu::ProgramSources::~ProgramSources((ProgramSources *)local_280);
  std::__cxx11::string::~string((string *)triG);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)triB);
  std::__cxx11::string::~string((string *)triW);
  std::__cxx11::string::~string((string *)positions);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)local_458);
  std::__cxx11::string::~string((string *)&score);
  glu::operator<<((TestLog *)log,&program);
  if (program.m_program.m_info.linkOk != false) {
    if (this->m_projective == false) {
      fVar16 = 1.0;
      fVar11 = 1.0;
      fVar12 = 1.0;
      fVar18 = 1.0;
    }
    else {
      fVar18 = 1.3;
      fVar12 = 0.8;
      fVar11 = 0.6;
      fVar16 = 2.0;
    }
    positions[0] = -fVar18;
    positions[2] = 0.0;
    positions[4] = -fVar12;
    positions[6] = 0.0;
    positions[9] = -fVar11;
    positions[10] = 0.0;
    positions[0xe] = 0.0;
    positions[1] = positions[0];
    positions[3] = fVar18;
    positions[5] = fVar12;
    positions[7] = fVar12;
    positions[8] = fVar11;
    positions[0xb] = fVar11;
    positions[0xc] = fVar16;
    positions[0xd] = fVar16;
    positions[0xf] = fVar16;
    tcu::operator-((tcu *)local_280,&this->m_max,&this->m_min);
    tcu::operator/((tcu *)&scale,1.0,(Vector<float,_3> *)local_280);
    tcu::operator*((tcu *)local_280,-1.0,&this->m_min);
    tcu::operator*((tcu *)&bias,(Vector<float,_3> *)local_280,&scale);
    auVar15._4_4_ = scale.m_data[2];
    auVar15._0_4_ = scale.m_data[1];
    auVar13._4_4_ = scale.m_data[1];
    auVar13._0_4_ = scale.m_data[0];
    auVar17._0_4_ = 0.0 - bias.m_data[0];
    auVar17._4_4_ = 0.5 - bias.m_data[1];
    auVar17._8_4_ = 1.0 - bias.m_data[2];
    auVar17._12_4_ = 0.5 - bias.m_data[0];
    local_434 = (1.0 - bias.m_data[0]) / scale.m_data[0];
    auVar13._8_4_ = scale.m_data[2];
    auVar13._12_4_ = scale.m_data[0];
    _local_458 = divps(auVar17,auVar13);
    auVar14._0_4_ = 1.0 - bias.m_data[1];
    auVar14._4_4_ = 0.5 - bias.m_data[2];
    auVar14._8_8_ = 0;
    auVar15._8_8_ = 0;
    auVar15 = divps(auVar14,auVar15);
    local_448._M_allocated_capacity = auVar15._0_8_;
    local_430 = local_458._4_4_;
    local_448._8_4_ = local_458._12_4_;
    local_448._12_4_ = (0.0 - bias.m_data[1]) / scale.m_data[1];
    local_438 = auVar15._4_4_;
    local_42c = (0.0 - bias.m_data[2]) / scale.m_data[2];
    poVar1 = (ostringstream *)(local_280 + 8);
    local_280._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"a_coords = ");
    tcu::Vector<float,_3>::Vector(triB,0.0);
    tcu::operator-((tcu *)triG,triB,&bias);
    tcu::operator/((tcu *)&score,triG,&scale);
    tcu::operator<<((ostream *)poVar1,(Vector<float,_3> *)&score);
    std::operator<<((ostream *)poVar1," -> ");
    tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&reference,1.0);
    tcu::operator-((tcu *)&rendered,(Vector<float,_3> *)&reference,&bias);
    tcu::operator/((tcu *)triW,(Vector<float,_3> *)&rendered,&scale);
    tcu::operator<<((ostream *)poVar1,triW);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    poVar1 = (ostringstream *)(local_280 + 8);
    local_280._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"u_scale = ");
    tcu::operator<<((ostream *)poVar1,&scale);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    poVar1 = (ostringstream *)(local_280 + 8);
    local_280._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"u_bias = ");
    tcu::operator<<((ostream *)poVar1,&bias);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    bVar3 = isValidFloatVec<3>(this->m_precision,&scale);
    if (bVar3) {
      bVar3 = isValidFloatVec<3>(this->m_precision,&bias);
      if (bVar3) {
        uVar10 = 0;
        while( true ) {
          if (uVar10 == 0xc) {
            index = glwGetAttribLocation(program.m_program.m_program,"a_position");
            index_00 = glwGetAttribLocation(program.m_program.m_program,"a_coords");
            glwEnableVertexAttribArray(index);
            glwVertexAttribPointer(index,4,0x1406,'\0',0,positions);
            glwEnableVertexAttribArray(index_00);
            glwVertexAttribPointer(index_00,3,0x1406,'\0',0,local_458);
            glwUseProgram(program.m_program.m_program);
            GVar5 = glwGetUniformLocation(program.m_program.m_program,"u_scale");
            glwUniform3f(GVar5,scale.m_data[0],scale.m_data[1],scale.m_data[2]);
            GVar5 = glwGetUniformLocation(program.m_program.m_program,"u_bias");
            glwUniform3f(GVar5,bias.m_data[0],bias.m_data[1],bias.m_data[2]);
            err = glwGetError();
            glu::checkError(err,"After program setup",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/accuracy/es2aVaryingInterpolationTests.cpp"
                            ,0xfd);
            tcu::Surface::Surface(&rendered,0x80,0x80);
            tcu::Surface::Surface(&reference,0x80,0x80);
            glwViewport(iVar4,y,0x80,0x80);
            glwDrawElements(4,6,0x1403,iterate::indices);
            pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
            tcu::SurfaceAccess::SurfaceAccess
                      ((SurfaceAccess *)local_280,&reference,&pRVar7->m_pixelFormat);
            local_420 = (float)(int)local_280._20_4_;
            local_428 = (float)(int)local_280._24_4_;
            score = local_458._0_4_;
            local_414 = fStack_44c;
            local_410 = (float)local_448._8_4_;
            local_40c = local_434;
            local_408._M_allocated_capacity._0_4_ = local_448._8_4_;
            local_408._M_allocated_capacity._4_4_ = fStack_44c;
            triG[0].m_data[0] = (float)local_458._4_4_;
            triG[0].m_data[1] = (float)local_448._M_allocated_capacity._0_4_;
            triG[0].m_data[2] = (float)local_448._12_4_;
            triG[1].m_data[0] = local_430;
            triG[1].m_data[1] = (float)local_448._12_4_;
            triG[1].m_data[2] = (float)local_448._M_allocated_capacity._0_4_;
            triB[0].m_data[0] = fStack_450;
            triB[0].m_data[1] = (float)local_448._M_allocated_capacity._4_4_;
            triB[0].m_data[2] = local_438;
            triB[1].m_data[0] = local_42c;
            triB[1].m_data[1] = local_438;
            triB[1].m_data[2] = (float)local_448._M_allocated_capacity._4_4_;
            iVar6 = local_280._20_4_;
            triW[0].m_data[0] = fVar18;
            triW[0].m_data[1] = fVar12;
            triW[0].m_data[2] = fVar11;
            triW[1].m_data[0] = fVar16;
            triW[1].m_data[1] = fVar11;
            triW[1].m_data[2] = fVar12;
            for (y_00 = 0; y_00 < (int)local_280._24_4_; y_00 = y_00 + 1) {
              local_41c = ((float)y_00 + 0.5) / local_428;
              local_424 = 1.0 - local_41c;
              for (x = 0; x < iVar6; x = x + 1) {
                fVar16 = ((float)x + 0.5) / local_420;
                bVar3 = 1.0 <= local_41c + fVar16;
                fVar12 = local_41c;
                if (bVar3) {
                  fVar16 = 1.0 - fVar16;
                  fVar12 = local_424;
                }
                uVar10 = (ulong)bVar3;
                w = triW + uVar10;
                fVar11 = projectedTriInterpolate((Vec3 *)(&score + uVar10 * 3),w,fVar16,fVar12);
                fVar18 = projectedTriInterpolate(triG + uVar10,w,fVar16,fVar12);
                fVar12 = projectedTriInterpolate(triB + uVar10,w,fVar16,fVar12);
                local_2d0.m_data[2] = fVar12 * scale.m_data[2] + bias.m_data[2];
                local_2d0.m_data[1] = fVar18 * scale.m_data[1] + bias.m_data[1];
                local_2d0.m_data[0] = fVar11 * scale.m_data[0] + bias.m_data[0];
                local_2d0.m_data[3] = 1.0;
                tcu::SurfaceAccess::setPixel((SurfaceAccess *)local_280,&local_2d0,x,y_00);
                iVar6 = local_280._20_4_;
              }
            }
            pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
            tcu::Surface::getAccess((PixelBufferAccess *)local_280,&rendered);
            glu::readPixels(pRVar2,iVar4,y,(PixelBufferAccess *)local_280);
            score = tcu::measurePixelDiffAccuracy
                              ((TestLog *)log,"Result","Image comparison result",&reference,
                               &rendered,0x10,300,COMPARE_LOG_EVERYTHING);
            this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
            de::toString<int>((string *)local_280,&score);
            tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,(char *)local_280._0_8_);
            std::__cxx11::string::~string((string *)local_280);
            tcu::Surface::~Surface(&reference);
            tcu::Surface::~Surface(&rendered);
            goto LAB_00e332af;
          }
          bVar3 = isValidFloat(this->m_precision,*(float *)(local_458 + uVar10 * 4));
          if (!bVar3) break;
          bVar3 = isValidFloat(this->m_precision,
                               *(float *)(local_458 + uVar10 * 4) *
                               (&scale)[-(uVar10 / 3)].m_data[uVar10] +
                               (&bias)[-(uVar10 / 3)].m_data[uVar10]);
          uVar10 = uVar10 + 1;
          if (!bVar3) {
            pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar9,(char *)0x0,
                       "isValidFloat(m_precision, coords[ndx] * scale[ndx % 3] + bias[ndx % 3])",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/accuracy/es2aVaryingInterpolationTests.cpp"
                       ,0xe8);
LAB_00e33306:
            __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
        }
        pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar9,(char *)0x0,"isValidFloat(m_precision, coords[ndx])",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/accuracy/es2aVaryingInterpolationTests.cpp"
                   ,0xe7);
        goto LAB_00e33306;
      }
      pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar9,(char *)0x0,"isValidFloatVec(m_precision, bias)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/accuracy/es2aVaryingInterpolationTests.cpp"
                 ,0xe4);
    }
    else {
      pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar9,(char *)0x0,"isValidFloatVec(m_precision, scale)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/accuracy/es2aVaryingInterpolationTests.cpp"
                 ,0xe3);
    }
    __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  if (this->m_precision == PRECISION_HIGHP) {
    iVar4 = (*((this->super_TestCase).m_context)->m_contextInfo->_vptr_ContextInfo[7])();
    if ((char)iVar4 == '\0') {
      description = "Fragment highp not supported";
      testResult = QP_TEST_RESULT_NOT_SUPPORTED;
      goto LAB_00e332a5;
    }
  }
  description = "Compile failed";
  testResult = QP_TEST_RESULT_FAIL;
LAB_00e332a5:
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,testResult,description);
LAB_00e332af:
  glu::ShaderProgram::~ShaderProgram(&program);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&templateParams._M_t);
  return STOP;
}

Assistant:

InterpolationCase::IterateResult InterpolationCase::iterate (void)
{
	TestLog&		log				= m_testCtx.getLog();
	de::Random		rnd				(deStringHash(getName()));
	int				viewportWidth	= 128;
	int				viewportHeight	= 128;

	if (m_context.getRenderTarget().getWidth() < viewportWidth ||
		m_context.getRenderTarget().getHeight() < viewportHeight)
		throw tcu::NotSupportedError("Too small viewport", "", __FILE__, __LINE__);

	int				viewportX		= rnd.getInt(0, m_context.getRenderTarget().getWidth()	- viewportWidth);
	int				viewportY		= rnd.getInt(0, m_context.getRenderTarget().getHeight()	- viewportHeight);

	static const char* s_vertShaderTemplate =
		"attribute highp vec4 a_position;\n"
		"attribute ${PRECISION} vec3 a_coords;\n"
		"varying ${PRECISION} vec3 v_coords;\n"
		"\n"
		"void main (void)\n"
		"{\n"
		"	gl_Position = a_position;\n"
		"	v_coords = a_coords;\n"
		"}\n";
	static const char* s_fragShaderTemplate =
		"varying ${PRECISION} vec3 v_coords;\n"
		"uniform ${PRECISION} vec3 u_scale;\n"
		"uniform ${PRECISION} vec3 u_bias;\n"
		"\n"
		"void main (void)\n"
		"{\n"
		"	gl_FragColor = vec4(v_coords * u_scale + u_bias, 1.0);\n"
		"}\n";

	map<string, string> templateParams;
	templateParams["PRECISION"] = glu::getPrecisionName(m_precision);

	glu::ShaderProgram program(m_context.getRenderContext(),
							   glu::makeVtxFragSources(tcu::StringTemplate(s_vertShaderTemplate).specialize(templateParams),
													   tcu::StringTemplate(s_fragShaderTemplate).specialize(templateParams)));
	log << program;
	if (!program.isOk())
	{
		if (m_precision == glu::PRECISION_HIGHP && !m_context.getContextInfo().isFragmentHighPrecisionSupported())
			m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Fragment highp not supported");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compile failed");
		return STOP;
	}

	// Position coordinates.
	Vec4 wCoord = m_projective ? Vec4(1.3f, 0.8f, 0.6f, 2.0f) : Vec4(1.0f, 1.0f, 1.0f, 1.0f);
	float positions[] =
	{
		-1.0f*wCoord.x(), -1.0f*wCoord.x(), 0.0f, wCoord.x(),
		-1.0f*wCoord.y(), +1.0f*wCoord.y(), 0.0f, wCoord.y(),
		+1.0f*wCoord.z(), -1.0f*wCoord.z(), 0.0f, wCoord.z(),
		+1.0f*wCoord.w(), +1.0f*wCoord.w(), 0.0f, wCoord.w()
	};

	// Coordinates for interpolation.
	tcu::Vec3 scale	= 1.0f / (m_max - m_min);
	tcu::Vec3 bias	= -1.0f*m_min*scale;
	float coords[] =
	{
		(0.0f - bias[0])/scale[0], (0.5f - bias[1])/scale[1], (1.0f - bias[2])/scale[2],
		(0.5f - bias[0])/scale[0], (1.0f - bias[1])/scale[1], (0.5f - bias[2])/scale[2],
		(0.5f - bias[0])/scale[0], (0.0f - bias[1])/scale[1], (0.5f - bias[2])/scale[2],
		(1.0f - bias[0])/scale[0], (0.5f - bias[1])/scale[1], (0.0f - bias[2])/scale[2]
	};

	log << TestLog::Message << "a_coords = " << ((tcu::Vec3(0.0f) - bias)/scale) << " -> " << ((tcu::Vec3(1.0f) - bias)/scale) << TestLog::EndMessage;
	log << TestLog::Message << "u_scale = " << scale << TestLog::EndMessage;
	log << TestLog::Message << "u_bias = " << bias << TestLog::EndMessage;

	// Verify that none of the inputs are denormalized / inf / nan.
	TCU_CHECK(isValidFloatVec(m_precision, scale));
	TCU_CHECK(isValidFloatVec(m_precision, bias));
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(coords); ndx++)
	{
		TCU_CHECK(isValidFloat(m_precision, coords[ndx]));
		TCU_CHECK(isValidFloat(m_precision, coords[ndx] * scale[ndx % 3] + bias[ndx % 3]));
	}

	// Indices.
	static const deUint16 indices[] = { 0, 1, 2, 2, 1, 3 };

	{
		const int	posLoc		= glGetAttribLocation(program.getProgram(), "a_position");
		const int	coordLoc	= glGetAttribLocation(program.getProgram(), "a_coords");

		glEnableVertexAttribArray(posLoc);
		glVertexAttribPointer(posLoc, 4, GL_FLOAT, GL_FALSE, 0, &positions[0]);

		glEnableVertexAttribArray(coordLoc);
		glVertexAttribPointer(coordLoc, 3, GL_FLOAT, GL_FALSE, 0, &coords[0]);
	}

	glUseProgram(program.getProgram());
	glUniform3f(glGetUniformLocation(program.getProgram(), "u_scale"), scale.x(), scale.y(), scale.z());
	glUniform3f(glGetUniformLocation(program.getProgram(), "u_bias"), bias.x(), bias.y(), bias.z());

	GLU_CHECK_MSG("After program setup");

	// Frames.
	tcu::Surface	rendered		(viewportWidth, viewportHeight);
	tcu::Surface	reference		(viewportWidth, viewportHeight);

	// Render with GL.
	glViewport(viewportX, viewportY, viewportWidth, viewportHeight);
	glDrawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(indices), GL_UNSIGNED_SHORT, &indices[0]);

	// Render reference \note While GPU is hopefully doing our draw call.
	renderReference(SurfaceAccess(reference, m_context.getRenderTarget().getPixelFormat()), coords, wCoord, scale, bias);

	glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, rendered.getAccess());

	// Compute difference.
	const int		bestScoreDiff	= 16;
	const int		worstScoreDiff	= 300;
	int				score			= tcu::measurePixelDiffAccuracy(log, "Result", "Image comparison result", reference, rendered, bestScoreDiff, worstScoreDiff, tcu::COMPARE_LOG_EVERYTHING);

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::toString(score).c_str());
	return STOP;
}